

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_paramSwitch_e ZVar2;
  U32 UVar3;
  undefined8 in_RAX;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  ZSTD_entropyCTables_t *CTable;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  undefined8 uStack_28;
  uint lit;
  
  bVar13 = 0;
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    CTable = optPtr->symbolCosts;
    if (CTable == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7fbe,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((CTable->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      uVar6 = 1;
      if (ZVar2 != ZSTD_ps_disable) {
        if (optPtr->litFreq == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fc7,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        for (lVar5 = 0; CTable = optPtr->symbolCosts, lVar5 != 0x100; lVar5 = lVar5 + 1) {
          UVar3 = HUF_getNbBitsFromCTable((HUF_CElt *)CTable,(U32)lVar5);
          if (0xb < UVar3) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7fcc,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar11 = 1 << (0xbU - (char)UVar3 & 0x1f);
          if (UVar3 == 0) {
            uVar11 = uVar6;
          }
          optPtr->litFreq[lVar5] = uVar11;
          optPtr->litSum = optPtr->litSum + uVar11;
        }
      }
      sVar1 = (short)(CTable->fse).litlengthCTable[0];
      lVar5 = 1;
      lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      if (sVar1 == 0) {
        lVar4 = lVar5;
      }
      optPtr->litLengthSum = 0;
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 1) {
        uVar11 = (CTable->fse).litlengthCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar11) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fd8,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar12 = 1 << (10U - (char)(uVar11 >> 0x10) & 0x1f);
        if (uVar11 < 0x10000) {
          uVar12 = uVar6;
        }
        optPtr->litLengthFreq[lVar7] = uVar12;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar12;
      }
      sVar1 = (short)(CTable->fse).matchlengthCTable[0];
      bVar13 = (char)sVar1 - 1U & 0x1f;
      lVar4 = (long)(1 << bVar13);
      if (sVar1 == 0) {
        lVar4 = lVar5;
      }
      optPtr->matchLengthSum = 0;
      for (uVar9 = (ulong)(uint)(0 << bVar13); uVar9 != 0x35; uVar9 = uVar9 + 1) {
        uVar11 = (CTable->fse).matchlengthCTable[lVar4 + uVar9 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar11) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fe4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar12 = 1 << (10U - (char)(uVar11 >> 0x10) & 0x1f);
        if (uVar11 < 0x10000) {
          uVar12 = uVar6;
        }
        optPtr->matchLengthFreq[uVar9] = uVar12;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar12;
      }
      sVar1 = (short)(CTable->fse).offcodeCTable[0];
      lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      if (sVar1 == 0) {
        lVar4 = lVar5;
      }
      optPtr->offCodeSum = 0;
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        uVar11 = (CTable->fse).offcodeCTable[lVar4 + lVar5 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar11) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7ff0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar12 = 1 << (10U - (char)(uVar11 >> 0x10) & 0x1f);
        if (uVar11 < 0x10000) {
          uVar12 = uVar6;
        }
        optPtr->offCodeFreq[lVar5] = uVar12;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar12;
      }
      goto LAB_0019fe0a;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7ff7,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar2 != ZSTD_ps_disable) {
      uStack_28 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,&lit,src,srcSize);
      UVar3 = ZSTD_downscaleStats(optPtr->litFreq,0xff,8,base_0possible);
      optPtr->litSum = UVar3;
    }
    memcpy(optPtr->litLengthFreq,&DAT_00251670,0x90);
    UVar3 = sum_u32((uint *)&DAT_00251670,0x24);
    optPtr->litLengthSum = UVar3;
    puVar8 = optPtr->matchLengthFreq;
    for (lVar5 = 0; lVar5 != 0x35; lVar5 = lVar5 + 1) {
      puVar8[lVar5] = 1;
    }
    optPtr->matchLengthSum = 0x35;
    puVar8 = &DAT_00251700;
    puVar10 = optPtr->offCodeFreq;
    for (lVar5 = 0x20; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar10 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
    }
    UVar3 = sum_u32(&DAT_00251700,0x20);
  }
  else {
    if (ZVar2 != ZSTD_ps_disable) {
      UVar3 = ZSTD_scaleStats(optPtr->litFreq,0xff,0xc);
      optPtr->litSum = UVar3;
    }
    UVar3 = ZSTD_scaleStats(optPtr->litLengthFreq,0x23,0xb);
    optPtr->litLengthSum = UVar3;
    UVar3 = ZSTD_scaleStats(optPtr->matchLengthFreq,0x34,0xb);
    optPtr->matchLengthSum = UVar3;
    UVar3 = ZSTD_scaleStats(optPtr->offCodeFreq,0x1f,0xb);
  }
  optPtr->offCodeSum = UVar3;
LAB_0019fe0a:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}